

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::ArrowButtonEx(char *str_id,ImGuiDir dir,ImVec2 size,ImGuiButtonFlags flags)

{
  ImGuiWindow *this;
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  ImGuiID id;
  ImU32 fill_col;
  ImU32 IVar4;
  int iVar5;
  ImGuiCol idx;
  float fVar6;
  ImVec2 IVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bool held;
  bool hovered;
  ImRect bb;
  bool local_72;
  bool local_71;
  ImVec2 local_70;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  ImRect local_40;
  
  pIVar1 = GImGui;
  auVar11._8_56_ = in_register_00001208;
  auVar11._0_8_ = size;
  _local_68 = auVar11._0_16_;
  local_70 = (ImVec2)vmovlps_avx(_local_68);
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    local_58 = vmovshdup_avx(_local_68);
    id = ImGuiWindow::GetID(this,str_id,(char *)0x0);
    IVar7 = (this->DC).CursorPos;
    auVar8._8_8_ = 0;
    auVar8._0_4_ = IVar7.x;
    auVar8._4_4_ = IVar7.y;
    auVar12._0_4_ = IVar7.x + (float)local_68._0_4_;
    auVar12._4_4_ = IVar7.y + (float)local_68._4_4_;
    auVar12._8_4_ = fStack_60 + 0.0;
    auVar12._12_4_ = fStack_5c + 0.0;
    local_40 = (ImRect)vmovlhps_avx(auVar8,auVar12);
    fVar6 = GetFrameHeight();
    if (fVar6 <= (float)local_58._0_4_) {
      fVar6 = (pIVar1->Style).FramePadding.y;
    }
    else {
      fVar6 = -1.0;
    }
    ItemSize(&local_70,fVar6);
    bVar3 = false;
    bVar2 = ItemAdd(&local_40,id,(ImRect *)0x0);
    if (bVar2) {
      local_58._0_4_ = dir;
      bVar3 = ButtonBehavior(&local_40,id,&local_71,&local_72,
                             ((this->DC).ItemFlags & 2U) << 9 | flags);
      iVar5 = ((local_72 ^ 1U) & local_71) + 0x15;
      idx = 0x17;
      if ((local_71 & 1U) == 0) {
        idx = iVar5;
      }
      if (local_72 == false) {
        idx = iVar5;
      }
      fill_col = GetColorU32(idx,1.0);
      IVar4 = GetColorU32(0,1.0);
      local_68._0_4_ = IVar4;
      RenderNavHighlight(&local_40,id,1);
      RenderFrame(local_40.Min,local_40.Max,fill_col,true,(pIVar1->Style).FrameRounding);
      auVar9._8_8_ = 0;
      auVar9._0_4_ = local_70.x;
      auVar9._4_4_ = local_70.y;
      fVar6 = pIVar1->FontSize;
      auVar13._4_4_ = fVar6;
      auVar13._0_4_ = fVar6;
      auVar13._8_4_ = fVar6;
      auVar13._12_4_ = fVar6;
      auVar8 = vsubps_avx(auVar9,auVar13);
      auVar10._0_4_ = auVar8._0_4_ * 0.5;
      auVar10._4_4_ = auVar8._4_4_ * 0.5;
      auVar10._8_4_ = auVar8._8_4_ * 0.5;
      auVar10._12_4_ = auVar8._12_4_ * 0.5;
      auVar8 = vcmpps_avx(auVar10,ZEXT816(0) << 0x20,6);
      auVar8 = vandps_avx(auVar8,auVar10);
      IVar7.x = local_40.Min.x + auVar8._0_4_;
      IVar7.y = local_40.Min.y + auVar8._4_4_;
      RenderArrow(this->DrawList,IVar7,local_68._0_4_,local_58._0_4_,1.0);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::ArrowButtonEx(const char* str_id, ImGuiDir dir, ImVec2 size, ImGuiButtonFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiID id = window->GetID(str_id);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    const float default_size = GetFrameHeight();
    ItemSize(size, (size.y >= default_size) ? g.Style.FramePadding.y : -1.0f);
    if (!ItemAdd(bb, id))
        return false;

    if (window->DC.ItemFlags & ImGuiItemFlags_ButtonRepeat)
        flags |= ImGuiButtonFlags_Repeat;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, flags);

    // Render
    const ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    const ImU32 text_col = GetColorU32(ImGuiCol_Text);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, bg_col, true, g.Style.FrameRounding);
    RenderArrow(window->DrawList, bb.Min + ImVec2(ImMax(0.0f, (size.x - g.FontSize) * 0.5f), ImMax(0.0f, (size.y - g.FontSize) * 0.5f)), text_col, dir);

    return pressed;
}